

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pose2texture.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  float fVar1;
  ushort uVar2;
  char cVar3;
  int row_1;
  int iVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  long lVar6;
  char *pcVar7;
  size_t sVar8;
  ostream *poVar9;
  long *plVar10;
  long *plVar11;
  size_type *psVar12;
  ulong uVar13;
  long lVar14;
  int row;
  long lVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  long *plVar20;
  uint uVar21;
  uint uVar23;
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  path vuiimpath;
  path bgrimbasename;
  path teximpath;
  path vuipath;
  vector<cv::Mat,_std::allocator<cv::Mat>_> tiles;
  Mat vuisrc;
  int option_index;
  Mat texture;
  path bgrimpath;
  Mat imgsrc;
  Mat cumul;
  allocator local_431;
  char *local_430;
  long local_428;
  char local_420 [16];
  undefined1 *local_410 [2];
  undefined1 local_400 [16];
  _InputArray local_3f0;
  char *local_3d8;
  long local_3d0;
  char local_3c8 [16];
  undefined1 *local_3b8;
  long local_3b0;
  undefined1 local_3a8 [16];
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_398;
  long *local_378;
  long lStack_370;
  long local_368;
  long lStack_360;
  uint *local_338;
  long *local_330;
  ulong local_318;
  ulong local_310;
  undefined8 local_304;
  undefined4 local_2fc;
  void *local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  long *local_2d8 [2];
  long local_2c8 [7];
  long *local_290;
  undefined1 local_278 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268 [6];
  Mat local_208 [96];
  Mat local_1a8 [144];
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  _InputArray local_f8 [3];
  long *local_b0;
  undefined8 local_98;
  allocator local_90 [16];
  long local_80;
  long *local_48;
  
  local_3b8 = local_3a8;
  local_3b0 = 0;
  local_3a8[0] = 0;
  local_2fc = 0;
  do {
    while (iVar4 = getopt_long(argc,argv,"hv:i:",long_options,&local_2fc), iVar4 == 0x69) {
      std::__cxx11::string::string((string *)local_278,_optarg,local_90);
      std::__cxx11::string::operator=((string *)&local_3b8,(string *)local_278);
      if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
        operator_delete((void *)local_278._0_8_);
      }
    }
  } while (iVar4 != -1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vui-folder: ",0xc);
  local_278._0_8_ = local_278 + 0x10;
  std::__cxx11::string::_M_construct<char*>((string *)local_278,local_3b8,local_3b8 + local_3b0);
  pbVar5 = boost::io::detail::quoted_out<char,std::char_traits<char>,std::__cxx11::string_const>
                     ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278
                      ,'&','\"');
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)pbVar5 + -0x18) + (char)pbVar5);
  std::ostream::put((char)pbVar5);
  std::ostream::flush();
  local_98 = 0x4b000000320;
  local_268[0]._M_allocated_capacity = 0;
  local_268[0]._8_8_ = 0;
  local_278._0_8_ = (long *)0x0;
  local_278._8_8_ = 0;
  cv::Mat::Mat((Mat *)local_90,&local_98,0x1d);
  lVar15 = (long)_optind;
  if (_optind < argc) {
    do {
      plVar20 = (long *)(local_278 + 0x10);
      std::__cxx11::string::string((string *)local_118,argv[lVar15],(allocator *)local_278);
      boost::filesystem::path::stem();
      local_f8[0]._0_8_ = &local_f8[0].sz;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_f8,local_278._0_8_,(pointer)(local_278._0_8_ + local_278._8_8_));
      if ((long *)local_278._0_8_ != plVar20) {
        operator_delete((void *)local_278._0_8_);
      }
      local_410[0] = local_400;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_410,local_f8[0]._0_8_,(long)local_f8[0].obj + local_f8[0]._0_8_);
      if ((Size *)local_f8[0]._0_8_ != &local_f8[0].sz) {
        operator_delete((void *)local_f8[0]._0_8_);
      }
      lVar6 = std::__cxx11::string::find((char *)local_410,0x1050b6,0);
      if (lVar6 == -1) {
        lVar6 = std::__cxx11::string::find((char *)local_410,0x1050d5,0);
        if (lVar6 != -1) {
          pcVar7 = basename(*argv);
          if (pcVar7 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x108120);
          }
          else {
            sVar8 = strlen(pcVar7);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,": skipping _IUV file  \'",0x17);
          goto LAB_00102981;
        }
        std::__cxx11::string::string((string *)local_278,argv[lVar15],(allocator *)&local_378);
        iVar4 = (int)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278;
        cv::imread((string *)local_f8,iVar4);
        if ((long *)local_278._0_8_ != plVar20) {
          operator_delete((void *)local_278._0_8_);
        }
        cVar3 = cv::Mat::empty();
        if (cVar3 == '\0') {
          if ((local_f8[0].flags & 0xff8U) != 0x10) {
            pcVar7 = basename(*argv);
            if (pcVar7 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x108120);
            }
            else {
              sVar8 = strlen(pcVar7);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,sVar8)
              ;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,": image file is not RGB \'",0x19);
            goto LAB_00102c0e;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"processing: ",0xc);
          std::__cxx11::string::string((string *)local_278,argv[lVar15],(allocator *)&local_378);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)local_278._0_8_,local_278._8_8_);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          if ((long *)local_278._0_8_ != plVar20) {
            operator_delete((void *)local_278._0_8_);
          }
          local_2d8[0] = local_2c8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"_IUV.png","");
          plVar10 = (long *)std::__cxx11::string::replace
                                      ((ulong)local_2d8,0,(char *)0x0,(ulong)local_410[0]);
          local_378 = &local_368;
          plVar11 = plVar10 + 2;
          if ((long *)*plVar10 == plVar11) {
            local_368 = *plVar11;
            lStack_360 = plVar10[3];
          }
          else {
            local_368 = *plVar11;
            local_378 = (long *)*plVar10;
          }
          lStack_370 = plVar10[1];
          *plVar10 = (long)plVar11;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          local_278._0_8_ = plVar20;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_278,local_378,lStack_370 + (long)local_378);
          local_430 = local_420;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_430,local_3b8,local_3b8 + local_3b0);
          boost::filesystem::path::operator/=((path *)&local_430,(path *)local_278);
          if ((long *)local_278._0_8_ != plVar20) {
            operator_delete((void *)local_278._0_8_);
          }
          if (local_378 != &local_368) {
            operator_delete(local_378);
          }
          if (local_2d8[0] != local_2c8) {
            operator_delete(local_2d8[0]);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t- ",3);
          local_278._0_8_ = plVar20;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_278,local_430,local_430 + local_428);
          pbVar5 = boost::io::detail::
                   quoted_out<char,std::char_traits<char>,std::__cxx11::string_const>
                             ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_278,'&','\"');
          if ((long *)local_278._0_8_ != plVar20) {
            operator_delete((void *)local_278._0_8_);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)pbVar5 + -0x18) + (char)pbVar5);
          std::ostream::put((char)pbVar5);
          std::ostream::flush();
          std::__cxx11::string::string((string *)local_278,local_430,(allocator *)local_2d8);
          cv::imread((string *)&local_378,iVar4);
          if ((long *)local_278._0_8_ != plVar20) {
            operator_delete((void *)local_278._0_8_);
          }
          cVar3 = cv::Mat::empty();
          if (cVar3 == '\0') {
            if (((uint)local_378 & 0xff8) != 0x10) {
              pcVar7 = basename(*argv);
              if (pcVar7 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x108120);
              }
              else {
                sVar8 = strlen(pcVar7);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,pcVar7,sVar8);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,": image file is not RGB \'",0x19);
              local_278._0_8_ = plVar20;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_278,local_430,local_430 + local_428);
              pbVar5 = boost::io::detail::
                       quoted_out<char,std::char_traits<char>,std::__cxx11::string_const>
                                 ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_278,'&','\"');
              if ((long *)local_278._0_8_ != plVar20) {
                operator_delete((void *)local_278._0_8_);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar5,"\'",1);
              std::ios::widen((char)*(undefined8 *)(*(long *)pbVar5 + -0x18) + (char)pbVar5);
              goto LAB_001030ac;
            }
            uVar16 = *local_338;
            uVar17 = local_338[1];
            local_2d8[0] = local_2c8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"_TEX.png","");
            plVar10 = (long *)std::__cxx11::string::replace
                                        ((ulong)local_2d8,0,(char *)0x0,(ulong)local_410[0]);
            psVar12 = (size_type *)(plVar10 + 2);
            if ((size_type *)*plVar10 == psVar12) {
              local_268[0]._0_8_ = *psVar12;
              local_268[0]._8_8_ = plVar10[3];
              local_278._0_8_ = plVar20;
            }
            else {
              local_268[0]._0_8_ = *psVar12;
              local_278._0_8_ = (size_type *)*plVar10;
            }
            local_278._8_8_ = plVar10[1];
            *plVar10 = (long)psVar12;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            local_3d8 = local_3c8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_3d8,local_278._0_8_,
                       (pointer)(local_278._0_8_ + local_278._8_8_));
            if ((long *)local_278._0_8_ != plVar20) {
              operator_delete((void *)local_278._0_8_);
            }
            if (local_2d8[0] != local_2c8) {
              operator_delete(local_2d8[0]);
            }
            local_318 = (ulong)uVar17;
            local_310 = (ulong)uVar16;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t- ",3);
            local_278._0_8_ = plVar20;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_278,local_3d8,local_3d8 + local_3d0);
            pbVar5 = boost::io::detail::
                     quoted_out<char,std::char_traits<char>,std::__cxx11::string_const>
                               ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_278,'&','\"');
            if ((long *)local_278._0_8_ != plVar20) {
              operator_delete((void *)local_278._0_8_);
            }
            std::ios::widen((char)*(undefined8 *)(*(long *)pbVar5 + -0x18) + (char)pbVar5);
            std::ostream::put((char)pbVar5);
            std::ostream::flush();
            local_304 = 0x4b000000320;
            local_268[0]._M_allocated_capacity = 0;
            local_268[0]._8_8_ = 0;
            local_278._0_8_ = (long *)0x0;
            local_278._8_8_ = 0;
            cv::Mat::Mat((Mat *)local_2d8,&local_304,0x1d);
            local_398.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_398.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_398.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            iVar4 = 0;
            do {
              iVar19 = 0;
              do {
                local_3f0.obj = (void *)0xc8000000c8;
                local_3f0.flags = iVar4 * 200;
                local_3f0._4_4_ = iVar19;
                cv::Mat::Mat((Mat *)local_278,(Mat *)local_2d8,(Rect_ *)&local_3f0);
                std::vector<cv::Mat,_std::allocator<cv::Mat>_>::emplace_back<cv::Mat>
                          (&local_398,(Mat *)local_278);
                cv::Mat::~Mat((Mat *)local_278);
                iVar19 = iVar19 + 200;
              } while (iVar19 != 0x4b0);
              iVar4 = iVar4 + 1;
            } while (iVar4 != 4);
            if (0 < (int)local_310) {
              uVar13 = 0;
              do {
                if (0 < (int)local_318) {
                  lVar6 = 0;
                  do {
                    lVar14 = *local_330 * uVar13 + local_368;
                    uVar16 = *(byte *)(lVar6 + lVar14) & 0x1f;
                    iVar4 = uVar16 - 1;
                    auVar29._0_8_ = (double)*(byte *)(lVar6 + 1 + lVar14) * 199.0;
                    auVar29._8_8_ = (255.0 - (double)*(byte *)(lVar6 + 2 + lVar14)) * 199.0;
                    auVar29 = divpd(auVar29,_DAT_00105020);
                    if ((byte)iVar4 < 0x18) {
                      uVar21 = (uint)auVar29._0_8_;
                      uVar23 = (uint)auVar29._8_8_;
                      auVar24._0_4_ = -(uint)(-0x7fffff39 < (int)(uVar21 ^ 0x80000000));
                      auVar24._4_4_ = -(uint)(-0x7fffff39 < (int)(uVar21 ^ 0x80000000));
                      auVar24._8_4_ = -(uint)(-0x7fffff39 < (int)(uVar23 ^ 0x80000000));
                      auVar24._12_4_ = -(uint)(-0x7fffff39 < (int)(uVar23 ^ 0x80000000));
                      uVar17 = movmskpd(iVar4,auVar24);
                      if (((byte)((byte)(uVar17 ^ 3) >> 1) != 0) && (((uVar17 ^ 3) & 1) != 0)) {
                        lVar18 = *local_b0 * uVar13 + (long)local_f8[0].sz;
                        lVar14 = (ulong)(uVar16 - 1) * 0x60;
                        lVar14 = (ulong)uVar23 *
                                 **(long **)(local_398.
                                             super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                             _M_impl.super__Vector_impl_data._M_start +
                                            lVar14 + 0x48) +
                                 *(long *)(local_398.
                                           super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                           _M_impl.super__Vector_impl_data._M_start + lVar14 + 0x10)
                        ;
                        uVar2 = *(ushort *)(lVar6 + 1 + lVar18);
                        auVar29 = *(undefined1 (*) [16])((ulong)uVar21 * 0x10 + lVar14);
                        auVar22._0_4_ = (float)*(byte *)(lVar6 + lVar18) + auVar29._0_4_;
                        auVar22._4_4_ = (float)(uVar2 & 0xff) + auVar29._4_4_;
                        auVar22._8_4_ = (float)(byte)(uVar2 >> 8) + auVar29._8_4_;
                        auVar22._12_4_ = auVar29._12_4_ + 1.0;
                        *(undefined1 (*) [16])((ulong)uVar21 * 0x10 + lVar14) = auVar22;
                      }
                    }
                    lVar6 = lVar6 + 3;
                  } while (local_318 * 3 != lVar6);
                }
                uVar13 = uVar13 + 1;
              } while (uVar13 != local_310);
            }
            cv::operator+((Mat *)local_278,(Mat *)local_90);
            (**(code **)(*(long *)local_278._0_8_ + 0x18))
                      (local_278._0_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_278,(Mat *)local_90,0xffffffff);
            cv::Mat::~Mat(local_1a8);
            cv::Mat::~Mat(local_208);
            cv::Mat::~Mat((Mat *)(local_278 + 0x10));
            lVar6 = 0;
            do {
              lVar14 = 0xc;
              do {
                lVar18 = *local_290 * lVar6 + local_2c8[0];
                fVar1 = *(float *)(lVar14 + lVar18);
                auVar26._8_8_ = 0;
                auVar26._0_8_ = *(ulong *)(lVar14 + -0xc + lVar18);
                auVar25._4_4_ = fVar1;
                auVar25._0_4_ = fVar1;
                auVar25._8_8_ = 0;
                auVar29 = divps(auVar26,auVar25);
                *(long *)(lVar14 + -0xc + lVar18) = auVar29._0_8_;
                *(float *)(lVar14 + -4 + lVar18) = *(float *)(lVar14 + -4 + lVar18) / fVar1;
                *(uint *)(lVar14 + lVar18) = -(uint)(fVar1 != 0.0) & 0x437f0000;
                lVar14 = lVar14 + 0x10;
              } while (lVar14 != 0x320c);
              lVar6 = lVar6 + 1;
            } while (lVar6 != 0x4b0);
            std::__cxx11::string::string((string *)local_278,local_3d8,&local_431);
            local_3f0.sz.width = 0;
            local_3f0.sz.height = 0;
            local_3f0.flags = 0x1010000;
            local_2e8 = 0;
            local_2f8 = (void *)0x0;
            uStack_2f0 = 0;
            local_3f0.obj = (Mat *)local_2d8;
            cv::imwrite((string *)local_278,&local_3f0,(vector *)&local_2f8);
            if (local_2f8 != (void *)0x0) {
              operator_delete(local_2f8);
            }
            if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
              operator_delete((void *)local_278._0_8_);
            }
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
            std::ostream::put(-0x10);
            std::ostream::flush();
            std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_398);
            cv::Mat::~Mat((Mat *)local_2d8);
            if (local_3d8 != local_3c8) {
              operator_delete(local_3d8);
            }
          }
          else {
            pcVar7 = basename(*argv);
            if (pcVar7 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x108120);
            }
            else {
              sVar8 = strlen(pcVar7);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,sVar8)
              ;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,": could not open file or invalid image file  \'",0x2e)
            ;
            local_278._0_8_ = local_278 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_278,local_430,local_430 + local_428);
            pbVar5 = boost::io::detail::
                     quoted_out<char,std::char_traits<char>,std::__cxx11::string_const>
                               ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_278,'&','\"');
            if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
              operator_delete((void *)local_278._0_8_);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar5,"\'",1);
            std::ios::widen((char)*(undefined8 *)(*(long *)pbVar5 + -0x18) + (char)pbVar5);
LAB_001030ac:
            std::ostream::put((char)pbVar5);
            std::ostream::flush();
          }
          cv::Mat::~Mat((Mat *)&local_378);
          if (local_430 != local_420) {
            operator_delete(local_430);
          }
        }
        else {
          pcVar7 = basename(*argv);
          if (pcVar7 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x108120);
          }
          else {
            sVar8 = strlen(pcVar7);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,": could not open file or invalid image file  \'",0x2e);
LAB_00102c0e:
          pcVar7 = argv[lVar15];
          if (pcVar7 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x108120);
          }
          else {
            sVar8 = strlen(pcVar7);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'",1);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
          std::ostream::put(' ');
          std::ostream::flush();
        }
        cv::Mat::~Mat((Mat *)local_f8);
      }
      else {
        pcVar7 = basename(*argv);
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x108120);
        }
        else {
          sVar8 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,": skipping _INDS file  \'",0x18);
LAB_00102981:
        pcVar7 = argv[lVar15];
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x108120);
        }
        else {
          sVar8 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'",1);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
        std::ostream::put(' ');
        std::ostream::flush();
      }
      if (local_410[0] != local_400) {
        operator_delete(local_410[0]);
      }
      if (local_118[0] != local_108) {
        operator_delete(local_118[0]);
      }
      lVar15 = lVar15 + 1;
    } while ((int)lVar15 != argc);
  }
  lVar15 = 0;
  do {
    lVar6 = 0xc;
    do {
      lVar14 = *local_48 * lVar15 + local_80;
      fVar1 = *(float *)(lVar6 + lVar14);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = *(ulong *)(lVar6 + -0xc + lVar14);
      auVar27._4_4_ = fVar1;
      auVar27._0_4_ = fVar1;
      auVar27._8_8_ = 0;
      auVar29 = divps(auVar28,auVar27);
      *(long *)(lVar6 + -0xc + lVar14) = auVar29._0_8_;
      *(float *)(lVar6 + -4 + lVar14) = *(float *)(lVar6 + -4 + lVar14) / fVar1;
      *(uint *)(lVar6 + lVar14) = -(uint)(fVar1 != 0.0) & 0x437f0000;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x320c);
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0x4b0);
  local_278._0_8_ = local_278 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"cumul.png","");
  local_f8[0].sz.width = 0;
  local_f8[0].sz.height = 0;
  local_f8[0].flags = 0x1010000;
  local_f8[0].obj = local_90;
  local_368 = 0;
  local_378 = (long *)0x0;
  lStack_370 = 0;
  cv::imwrite((string *)local_278,local_f8,(vector *)&local_378);
  if (local_378 != (long *)0x0) {
    operator_delete(local_378);
  }
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_);
  }
  cv::Mat::~Mat((Mat *)local_90);
  if (local_3b8 != local_3a8) {
    operator_delete(local_3b8);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv )
{
    boost::filesystem::path vuipath;

    int 	option_index = 0;
    while(1) {
        int c = getopt_long (argc, argv, "hv:i:",long_options, &option_index);
        if (c == -1)
            break;  // end of options
        switch (c) {
        case 'v':
            //verbose_level=atoi(optarg);
            break;
        case 'h':
            //usage(cerr,basename(argv[0]));
            //exit(1);
            break;		// never reached
        case 'i':
            // path to _INDS.png and _IUV.png folder
            vuipath=boost::filesystem::path(optarg);
            break;
        }
    }


    cout << "vui-folder: " << vuipath << endl;
    Mat   cumul(Size(800,1200),CV_32FC4,Scalar(0,0,0,0));
    int count=0;

    for(int i=optind; i<argc; i++) {
        boost::filesystem::path bgrimpath(argv[i]);
        boost::filesystem::path bgrimbasename=basename(bgrimpath);
        // skip *_INDS.png, *._IUV.png
        if(string::npos!=bgrimbasename.string().find("_INDS")) {
            cerr << basename(argv[0]) << ": skipping _INDS file  '" << argv[i] << "'" << endl;
            continue;
        }
        if(string::npos!=bgrimbasename.string().find("_IUV")) {
            cerr << basename(argv[0]) << ": skipping _IUV file  '" << argv[i] << "'" << endl;
            continue;
        }

        // read the source image file
        Mat imgsrc=imread(argv[i],1);
        if(imgsrc.empty()) {
            cerr << basename(argv[0]) << ": could not open file or invalid image file  '" << argv[i] << "'" << endl;
            continue;
        }
        if(imgsrc.channels()!=3) {
            cerr << basename(argv[0]) << ": image file is not RGB '" << argv[i] << "'" << endl;
            continue;
        }

        Size srcsize=imgsrc.size();

        cout << "processing: " << string(argv[i]) << endl;

        // get IUV file
        boost::filesystem::path vuiimpath= vuipath / boost::filesystem::path(bgrimbasename.string() + string("_IUV.png"));
        cout << "\t- " << vuiimpath << endl;

        Mat vuisrc=imread(vuiimpath.c_str(),1);
        if(vuisrc.empty()) {
            cerr << basename(argv[0]) << ": could not open file or invalid image file  '" << vuiimpath << "'" << endl;
            continue;
        }
        if(vuisrc.channels()!=3) {
            cerr << basename(argv[0]) << ": image file is not RGB '" << vuiimpath << "'" << endl;
            continue;
        }
        Size vuisize=vuisrc.size();
        /*
        // get INDS file
        boost::filesystem::path indimpath= vuipath / boost::filesystem::path(bgrimbasename.string() + string("_INDS.png"));
        cout << "\t- " << indimpath << endl;

        Mat indsrc=imread(indimpath.c_str(),-1);
        if(indsrc.empty()) {
            cerr << basename(argv[0]) << ": could not open file or invalid image file  '" << indimpath << "'" << endl;
            continue;
        }
        if(indsrc.channels()!=1) {
            cerr << basename(argv[0]) << ": image file is not 1 channel'" << indimpath << "'" << endl;
            continue;
        }
        Size indsize=indsrc.size();

        // get number of different values in ind matrix => should be nb of people seen
        std::vector<unsigned char> unik = unique(indsrc, true);

        for (unsigned int i = 0; i < unik.size(); i++)
            std::cout << (short)unik[i] << " ";
        */
        boost::filesystem::path teximpath= boost::filesystem::path(bgrimbasename.string() + string("_TEX.png"));
        cout << "\t- " << teximpath << endl;



        Mat   texture(Size(800,1200),CV_32FC4,Scalar(0,0,0,0));
        //Mat   texture=imread("SURREAL.png",1);
        //4x6=24 tiles, tile size 200*200
        vector<Mat>  tiles;
        for(int row=0; row<4; row++)
            for(int col=0; col<6; col++)
                tiles.push_back(texture(Rect(200*row,200*col,200,200)));


        //Mat   out=imgsrc;
        //out=Scalar(0,0,0);
        for(int row=0; row<vuisize.height; row++)
            for(int col=0; col<vuisize.width; col++) {
                unsigned int ind=0;
                Vec3b        vui=vuisrc.at<Vec3b>(row,col);

                int i= (unsigned)0x1F & vui[0];
                int u=(255.-float(vui[2]))*199./255.;
                int v=float(vui[1])*199./255.;
                /*
                if((i>0)&&(i<25))
                    if((u>=0)&&(u<200))
                        if((v>=0)&&(v<200))
                out.at<Vec3b>(row,col)=tiles[i-1].at<Vec3b>(u,v);
                */
                if((i>0)&&(i<25))
                    if((u>=0)&&(u<200))
                        if((v>=0)&&(v<200)) {
                            Vec3b pixsrc=imgsrc.at<Vec3b>(row,col); // image pixel
                            Vec4f texsrc=tiles[i-1].at<Vec4f>(u,v);
                            texsrc[0]+=(float)pixsrc[0];
                            texsrc[1]+=(float)pixsrc[1];
                            texsrc[2]+=(float)pixsrc[2];
                            texsrc[3]+=(float)1.0;
                            tiles[i-1].at<Vec4f>(u,v)=texsrc;
                            //tiles[i-1].at<Vec3b>(u,v)=imgsrc.at<Vec3b>(row,col);
                        }
            }
        cumul=cumul+texture;
        count+=1;
        for(int row=0; row<1200; row++)
            for(int col=0; col<800; col++) {
                Vec4f texsrc=texture.at<Vec4f>(row,col);
                texsrc[0]=float(texsrc[0])/float(texsrc[3]);
                texsrc[1]=float(texsrc[1])/float(texsrc[3]);
                texsrc[2]=float(texsrc[2])/float(texsrc[3]);
                texsrc[3]=(float)(texsrc[3] ? 255.0:0.0);
                texture.at<Vec4f>(row,col)=texsrc;
            }
        imwrite(teximpath.c_str(),texture);

        cout << endl;
    }

    for(int row=0; row<1200; row++)
        for(int col=0; col<800; col++) {
            Vec4f texsrc=cumul.at<Vec4f>(row,col);
            texsrc[0]=float(texsrc[0])/float(texsrc[3]);
            texsrc[1]=float(texsrc[1])/float(texsrc[3]);
            texsrc[2]=float(texsrc[2])/float(texsrc[3]);
            //texsrc[3]=(float)255.0;
            texsrc[3]=(float)(texsrc[3] ? 255.0:0.0);
            cumul.at<Vec4f>(row,col)=texsrc;
        }
    imwrite("cumul.png",cumul);

    return 0;
}